

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O3

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  uint uVar1;
  ElementCount index;
  uint uVar2;
  uint uVar3;
  word **ppwVar4;
  Builder result;
  Builder builder;
  Reader assignments;
  BuilderArena *pBVar5;
  word **ppwVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  Fault f;
  ThrowingErrorReporter errorReporter;
  ParserInput parserInput;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  ValueTranslator translator;
  Builder lexedTokens;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  undefined1 local_478 [56];
  ErrorReporter local_440;
  Builder local_438;
  SegmentBuilder *local_420;
  ElementCount local_418;
  short local_414;
  ListReader *local_410;
  uint local_408;
  Resolver local_400;
  ErrorReporter local_3f8;
  char local_3f0;
  OrphanBuilder local_3e8;
  ValueTranslator local_3c8;
  StructReader local_3a8;
  undefined8 local_378;
  undefined8 uStack_370;
  StructBuilder local_360;
  ListReader local_338;
  ListReader local_308;
  PointerReader local_2d8;
  MallocMessageBuilder local_2b8;
  CapnpParser local_1c8;
  
  local_440._vptr_ErrorReporter = (_func_int **)&PTR_addError_00626eb0;
  MallocMessageBuilder::MallocMessageBuilder(&local_2b8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_438,&local_2b8.super_MessageBuilder);
  local_1c8.orphanage.arena = (BuilderArena *)local_438.builder.segment;
  local_1c8.orphanage.capTable = local_438.builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_360,(PointerBuilder *)&local_1c8,(StructSize)0x10000);
  result._builder.capTable = local_360.capTable;
  result._builder.segment = local_360.segment;
  result._builder.data = local_360.data;
  result._builder.pointers = local_360.pointers;
  result._builder.dataSize = local_360.dataSize;
  result._builder.pointerCount = local_360.pointerCount;
  result._builder._38_2_ = local_360._38_2_;
  input_00.size_ = input.content.size_ - 1;
  input_00.ptr = input.content.ptr;
  capnp::compiler::lex(input_00,result,&local_440);
  orphanageParam = MessageBuilder::getOrphanage(&local_2b8.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser(&local_1c8,orphanageParam,&local_440);
  capnp::_::StructBuilder::asReader(&local_360);
  bVar9 = local_414 == 0;
  local_478._16_8_ = local_420;
  if (bVar9) {
    local_478._16_8_ = (SegmentBuilder *)0x0;
  }
  local_478._24_4_ = 0x7fffffff;
  if (!bVar9) {
    local_478._24_4_ = local_410._0_4_;
  }
  local_478._0_4_ = 0;
  local_478._4_4_ = 0;
  local_478._8_4_ = 0;
  local_478._12_4_ = 0;
  if (!bVar9) {
    local_478._0_4_ = local_438.builder.segment._0_4_;
    local_478._4_4_ = local_438.builder.segment._4_4_;
    local_478._8_4_ = local_438.builder.capTable._0_4_;
    local_478._12_4_ = local_438.builder.capTable._4_4_;
  }
  capnp::_::PointerReader::getList
            (&local_338,(PointerReader *)local_478,INLINE_COMPOSITE,(word *)0x0);
  local_438.builder.segment = (SegmentBuilder *)0x0;
  local_438.builder.pointer._0_4_ = 0;
  local_418 = local_338.elementCount;
  local_408 = 0;
  local_438.builder.capTable = (CapTableBuilder *)&local_338;
  local_420 = (SegmentBuilder *)&local_338;
  local_410 = &local_338;
  if (local_338.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_478,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal((Fault *)local_478);
  }
  (*(code *)**(undefined8 **)local_1c8.parsers.expression.wrapper)
            (local_478,local_1c8.parsers.expression.wrapper,local_1c8.parsers.expression.parser);
  local_3f0 = local_478[0];
  if (local_478[0] == '\x01') {
    local_3e8.segment = (SegmentBuilder *)local_478._16_8_;
    local_3e8.capTable = (CapTableBuilder *)local_478._24_8_;
    local_3e8.location = (word *)local_478._32_8_;
    local_3e8.tag.content = local_478._8_8_;
    if ((uint)local_438.builder.pointer != local_338.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                ((Fault *)local_478,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal((Fault *)local_478);
    }
    capnp::_::OrphanBuilder::asStructReader(&local_3a8,&local_3e8,(StructSize)0x20003);
    if ((local_3a8.dataSize < 0x10) || (*local_3a8.data != 7)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_478,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x74,FAILED,"expression.isTuple()","\"Input does not contain a struct.\"",
                 (char (*) [33])"Input does not contain a struct.");
      kj::_::Debug::Fault::fatal((Fault *)local_478);
    }
    local_378 = local_3a8.segment;
    uStack_370 = local_3a8.capTable;
    local_3f8._vptr_ErrorReporter = (_func_int **)&PTR_addError_00626eb0;
    local_400._vptr_Resolver = (_func_int **)&PTR_resolveConstant_00626ee8;
    local_478._32_4_ = output.builder.dataSize;
    local_478._36_2_ = output.builder.pointerCount;
    local_478._38_2_ = output.builder._38_2_;
    local_478._16_8_ = output.builder.data;
    local_478._24_8_ = output.builder.pointers;
    local_478._0_8_ = output.builder.segment;
    local_478._8_8_ = output.builder.capTable;
    pBVar5 = capnp::_::StructBuilder::getArena((StructBuilder *)local_478);
    local_3c8.orphanage.capTable = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_478);
    local_3c8.resolver = &local_400;
    local_3c8.errorReporter = &local_3f8;
    local_478._0_8_ = output.schema.super_Schema.raw;
    local_478._8_8_ = output.builder.segment;
    local_478._16_8_ = output.builder.capTable;
    local_478._24_8_ = output.builder.data;
    local_478._32_8_ = output.builder.pointers;
    local_478._40_4_ = output.builder.dataSize;
    local_478._44_2_ = output.builder.pointerCount;
    local_478._46_2_ = output.builder._38_2_;
    local_2d8.segment._0_4_ = 0;
    local_2d8.segment._4_4_ = 0;
    local_2d8.capTable._0_4_ = 0;
    local_2d8.capTable._4_4_ = 0;
    local_2d8.pointer = local_3a8.pointers;
    if (local_3a8.pointerCount == 0) {
      local_2d8.pointer = (WirePointer *)0x0;
    }
    local_2d8.nestingLimit = 0x7fffffff;
    if (local_3a8.pointerCount != 0) {
      local_2d8.segment._0_4_ = (undefined4)local_378;
      local_2d8.segment._4_4_ = local_378._4_4_;
      local_2d8.capTable._0_4_ = (undefined4)uStack_370;
      local_2d8.capTable._4_4_ = uStack_370._4_4_;
      local_2d8.nestingLimit = local_3a8.nestingLimit;
    }
    local_3c8.orphanage.arena = pBVar5;
    capnp::_::PointerReader::getList(&local_308,&local_2d8,INLINE_COMPOSITE,(word *)0x0);
    builder.builder.segment = (SegmentBuilder *)local_478._8_8_;
    builder.schema.super_Schema.raw = (Schema)(Schema)local_478._0_8_;
    builder.builder.capTable = (CapTableBuilder *)local_478._16_8_;
    builder.builder.data = (void *)local_478._24_8_;
    builder.builder.pointers = (WirePointer *)local_478._32_8_;
    builder.builder.dataSize = local_478._40_4_;
    builder.builder.pointerCount = local_478._44_2_;
    builder.builder._38_2_ = local_478._46_2_;
    assignments.reader.capTable = local_308.capTable;
    assignments.reader.segment = local_308.segment;
    assignments.reader.ptr = local_308.ptr;
    assignments.reader.elementCount = local_308.elementCount;
    assignments.reader.step = local_308.step;
    assignments.reader.structDataSize = local_308.structDataSize;
    assignments.reader.structPointerCount = local_308.structPointerCount;
    assignments.reader.elementSize = local_308.elementSize;
    assignments.reader._39_1_ = local_308._39_1_;
    assignments.reader.nestingLimit = local_308.nestingLimit;
    assignments.reader._44_4_ = local_308._44_4_;
    capnp::compiler::ValueTranslator::fillStructValue(&local_3c8,builder,assignments);
  }
  else {
    index = local_408;
    if (local_408 < (uint)local_438.builder.pointer) {
      index = (uint)local_438.builder.pointer;
    }
    if (index == local_338.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_478,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal((Fault *)local_478);
    }
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_478,
               *(ListReader **)
                ((long)&local_438 + (ulong)((uint)local_438.builder.pointer <= local_408) * 0x20 + 8
                ),index);
    uVar7 = 0;
    if ((uint)local_478._32_4_ < 0x40) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)*(uint *)((long)&((SegmentReader *)local_478._16_8_)->arena + 4);
      if (0x9f < (uint)local_478._32_4_) {
        uVar7 = (ulong)*(uint *)&(((SegmentReader *)local_478._16_8_)->ptr).ptr;
      }
    }
    (**local_440._vptr_ErrorReporter)(&local_440,uVar8,uVar7,"Parse error",0xc);
  }
  if ((local_3f0 == '\x01') && (local_3e8.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&local_3e8);
  }
  if (local_438.builder.segment != (SegmentBuilder *)0x0) {
    uVar2 = local_408;
    ppwVar4 = (word **)&local_410;
    if (local_408 < (uint)local_438.builder.pointer) {
      uVar2 = (uint)local_438.builder.pointer;
      ppwVar4 = (word **)&local_438.builder.capTable;
    }
    uVar1 = *(uint *)&(local_438.builder.segment)->readOnly;
    uVar3 = uVar2;
    if (uVar2 <= uVar1) {
      uVar3 = uVar1;
    }
    ppwVar6 = &(local_438.builder.segment)->pos;
    if (uVar1 < uVar2) {
      ppwVar6 = ppwVar4;
    }
    (local_438.builder.segment)->pos = (word *)*ppwVar6;
    *(uint *)&(local_438.builder.segment)->readOnly = uVar3;
  }
  capnp::compiler::CapnpParser::~CapnpParser(&local_1c8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_2b8);
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&output](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.");

    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}